

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,DataTypeSyntax **args_5,
          DeclaratorSyntax *args_6)

{
  DataTypeSyntax *pDVar1;
  size_t sVar2;
  pointer ppAVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxNode *pSVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  FunctionPortSyntax *pFVar26;
  long lVar27;
  
  pFVar26 = (FunctionPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPortSyntax *)this->endPtr < pFVar26 + 1) {
    pFVar26 = (FunctionPortSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pFVar26 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar5 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar6 = args_3->info;
  TVar22 = args_4->kind;
  uVar23 = args_4->field_0x2;
  NVar24.raw = (args_4->numFlags).raw;
  uVar25 = args_4->rawLen;
  pIVar7 = args_4->info;
  pDVar1 = *args_5;
  (pFVar26->super_FunctionPortBaseSyntax).super_SyntaxNode.kind = FunctionPort;
  (pFVar26->super_FunctionPortBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pFVar26->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pFVar26->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar8 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pFVar26->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar26->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pFVar26->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar8;
  (pFVar26->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pFVar26->attributes).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pFVar26->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pFVar26->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar2;
  (pFVar26->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc3a8;
  (pFVar26->constKeyword).kind = TVar10;
  (pFVar26->constKeyword).field_0x2 = uVar11;
  (pFVar26->constKeyword).numFlags = (NumericTokenFlags)NVar12.raw;
  (pFVar26->constKeyword).rawLen = uVar13;
  (pFVar26->constKeyword).info = pIVar4;
  (pFVar26->direction).kind = TVar14;
  (pFVar26->direction).field_0x2 = uVar15;
  (pFVar26->direction).numFlags = (NumericTokenFlags)NVar16.raw;
  (pFVar26->direction).rawLen = uVar17;
  (pFVar26->direction).info = pIVar5;
  (pFVar26->staticKeyword).kind = TVar18;
  (pFVar26->staticKeyword).field_0x2 = uVar19;
  (pFVar26->staticKeyword).numFlags = (NumericTokenFlags)NVar20.raw;
  (pFVar26->staticKeyword).rawLen = uVar21;
  (pFVar26->staticKeyword).info = pIVar6;
  (pFVar26->varKeyword).kind = TVar22;
  (pFVar26->varKeyword).field_0x2 = uVar23;
  (pFVar26->varKeyword).numFlags = (NumericTokenFlags)NVar24.raw;
  (pFVar26->varKeyword).rawLen = uVar25;
  (pFVar26->varKeyword).info = pIVar7;
  pFVar26->dataType = pDVar1;
  (pFVar26->declarator).ptr = args_6;
  (pFVar26->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pFVar26;
  sVar2 = (pFVar26->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppAVar3 = (pFVar26->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar27 = 0;
    do {
      *(FunctionPortSyntax **)(*(long *)((long)ppAVar3 + lVar27) + 8) = pFVar26;
      lVar27 = lVar27 + 8;
    } while (sVar2 << 3 != lVar27);
  }
  if (pDVar1 != (DataTypeSyntax *)0x0) {
    (pDVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pFVar26;
  }
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)pFVar26;
  return pFVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }